

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::fresnel::schlick::zero_value(schlick *this)

{
  _func_int **pp_Var1;
  void *__s;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  long in_RSI;
  value_type vVar3;
  
  pp_Var1 = *(_func_int ***)(in_RSI + 8);
  (this->super_impl)._vptr_impl = pp_Var1;
  __s = operator_new((long)pp_Var1 * 4);
  (this->f0)._M_size = (size_t)__s;
  pfVar2 = extraout_RDX;
  if (pp_Var1 != (_func_int **)0x0) {
    memset(__s,0,(long)pp_Var1 * 4);
    pfVar2 = extraout_RDX_00;
  }
  vVar3._M_data = pfVar2;
  vVar3._M_size = (size_t)this;
  return vVar3;
}

Assistant:

const brdf::value_type zero_value() const {
			return brdf::value_type(float_t(0), f0.size());
		}